

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

void __thiscall om::concurrency::thread_pool::_worker_thread(thread_pool *this)

{
  bool bVar1;
  function<void_()> task;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  while (((this->_done)._M_base._M_i & 1U) == 0) {
    local_28 = 0;
    uStack_20 = 0;
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    bVar1 = queue<std::function<void_()>_>::dequeue
                      (&this->_task_queue,(function<void_()> *)&local_38);
    if (bVar1) {
      std::function<void_()>::operator()((function<void_()> *)&local_38);
    }
    else {
      sched_yield();
    }
    Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  }
  return;
}

Assistant:

void _worker_thread()
			{
				while (!_done) {
					std::function<void()> task;

					if (_task_queue.dequeue(task)) {
						task();
					} else {
						std::this_thread::yield();
					}
				}
			}